

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O1

void uv__queue_split(uv__queue *h,uv__queue *q,uv__queue *n)

{
  uv__queue *n_local;
  uv__queue *q_local;
  uv__queue *h_local;
  
  n->prev = h->prev;
  n->prev->next = n;
  n->next = q;
  h->prev = q->prev;
  h->prev->next = h;
  q->prev = n;
  return;
}

Assistant:

static inline void uv__queue_split(struct uv__queue* h,
                                   struct uv__queue* q,
                                   struct uv__queue* n) {
  n->prev = h->prev;
  n->prev->next = n;
  n->next = q;
  h->prev = q->prev;
  h->prev->next = h;
  q->prev = n;
}